

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise3D::ConvolutionDepthWise3D(ConvolutionDepthWise3D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__ConvolutionDepthWise3D_009b8c90;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x25));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2e));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x37));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

ConvolutionDepthWise3D::ConvolutionDepthWise3D()
{
    one_blob_only = true;
    support_inplace = false;
}